

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoOrDieDeathTest_FlagDoesNotExist::Run(void)

{
  FlagSaver fs;
  FlagSaver local_e0;
  CommandLineFlagInfo local_d8;
  
  FlagSaver::FlagSaver(&local_e0);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoOrDieDeathTest","FlagDoesNotExist");
  g_called_exit = 0;
  gflags_exitfunc = CalledExit;
  GetCommandLineFlagInfoOrDie(&local_d8,"test_int3210");
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieDeathTest_FlagDoesNotExist::Run();
  return;
}

Assistant:

TEST(GetCommandLineFlagInfoOrDieDeathTest, FlagDoesNotExist) {
  EXPECT_DEATH(GetCommandLineFlagInfoOrDie("test_int3210"),
               ".*: flag test_int3210 does not exist");
}